

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  cpp *this_00;
  ulong uVar1;
  int iVar2;
  uint uVar3;
  LogMessage *pLVar4;
  FieldGenerator *pFVar5;
  Descriptor *pDVar6;
  pointer ppFVar7;
  ulong uVar8;
  undefined8 *puVar9;
  uint uVar10;
  AlphaNum *b;
  pointer ppFVar11;
  bool bVar12;
  int extraout_EDX;
  int iVar13;
  uint i_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar14;
  FieldDescriptor *field;
  ulong uVar15;
  FieldDescriptor *field_00;
  int iVar16;
  int iVar17;
  AlphaNum *c;
  int iVar18;
  char *pcVar19;
  AlphaNum *pAVar20;
  int i;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int j;
  protobuf *this_01;
  bool bVar25;
  Hex hex;
  AlphaNum *in_stack_fffffffffffffd48;
  int local_29c;
  int local_298;
  allocator<char> local_291;
  undefined8 local_290;
  char *local_288;
  char *local_280;
  FieldGeneratorMap *local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  AlphaNum local_228;
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks_for_has_bits;
  string result;
  string m;
  AlphaNum local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  AlphaNum local_e0;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  
  pDVar6 = this->descriptor_;
  if (*(char *)(*(long *)(pDVar6 + 0x20) + 0x68) == '\x01') {
    io::Printer::Print(printer,
                       "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n  size_t total_size = _extensions_.MessageSetByteSize();\n"
                       ,"classname",&this->classname_,"full_name",*(string **)(pDVar6 + 8));
    if (((this->options_).enforce_lite == true) ||
       (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) == 3)) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&local_288,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xf64);
      pLVar4 = internal::LogMessage::operator<<
                         ((LogMessage *)&local_288,
                          "CHECK failed: UseUnknownFieldSet(descriptor_->file(), options_): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar4);
      internal::LogMessage::~LogMessage((LogMessage *)&local_288);
    }
    io::Printer::Print(printer,
                       "if (_internal_metadata_.have_unknown_fields()) {\n  total_size += ::google::protobuf::internal::WireFormat::\n      ComputeUnknownMessageSetItemsSize(unknown_fields());\n}\n"
                      );
    pcVar19 = 
    "  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\n  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n  _cached_size_ = cached_size;\n  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n  return total_size;\n}\n"
    ;
  }
  else {
    if ((1 < this->num_required_fields_) && (*(int *)(*(long *)(pDVar6 + 0x10) + 0x8c) != 3)) {
      io::Printer::Print(printer,
                         "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n// @@protoc_insertion_point(required_fields_byte_size_fallback_start:$full_name$)\n"
                         ,"classname",&this->classname_,"full_name",*(string **)(pDVar6 + 8));
      io::Printer::Indent(printer);
      io::Printer::Print(printer,"size_t total_size = 0;\n");
      pFVar14 = extraout_RDX;
      for (uVar21 = 0;
          ppFVar7 = (this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar21 < (ulong)((long)(this->optimized_order_).
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7 >> 3);
          uVar21 = uVar21 + 1) {
        this_00 = (cpp *)ppFVar7[uVar21];
        if (*(int *)(this_00 + 0x4c) == 2) {
          FieldName_abi_cxx11_((string *)&local_288,this_00,pFVar14);
          io::Printer::Print(printer,"\nif (has_$name$()) {\n","name",(string *)&local_288);
          std::__cxx11::string::~string((string *)&local_288);
          io::Printer::Indent(printer);
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>
                    (printer,(FieldDescriptor *)this_00);
          pFVar5 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)this_00);
          (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          pFVar14 = extraout_RDX_00;
        }
      }
      io::Printer::Print(printer,"\nreturn total_size;\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      pDVar6 = this->descriptor_;
    }
    c = (AlphaNum *)0x35721c;
    io::Printer::Print(printer,
                       "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n"
                       ,"classname",&this->classname_,"full_name",*(string **)(pDVar6 + 8));
    io::Printer::Indent(printer);
    io::Printer::Print(printer,"size_t total_size = 0;\n\n");
    pDVar6 = this->descriptor_;
    if (0 < *(int *)(pDVar6 + 0x68)) {
      io::Printer::Print(printer,"total_size += _extensions_.ByteSize();\n\n");
      pDVar6 = this->descriptor_;
    }
    if (*(int *)(*(long *)(pDVar6 + 0x10) + 0x8c) != 3) {
      if (((this->options_).enforce_lite == false) &&
         (*(int *)(*(long *)(*(long *)(pDVar6 + 0x10) + 0xa0) + 0xa8) != 3)) {
        pcVar19 = 
        "if (_internal_metadata_.have_unknown_fields()) {\n  total_size +=\n    ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n      unknown_fields());\n}\n"
        ;
      }
      else {
        pcVar19 = "total_size += unknown_fields().size();\n\n";
      }
      io::Printer::Print(printer,pcVar19);
    }
    if ((this->num_required_fields_ < 2) ||
       (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3)) {
      uVar21 = 0;
      while( true ) {
        ppFVar7 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->optimized_order_).
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7 >> 3) <= uVar21
           ) break;
        pFVar14 = ppFVar7[uVar21];
        if (*(int *)(pFVar14 + 0x4c) == 2) {
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar14);
          FieldName_abi_cxx11_((string *)&local_288,(cpp *)pFVar14,field);
          io::Printer::Print(printer,"if (has_$name$()) {\n","name",(string *)&local_288);
          std::__cxx11::string::~string((string *)&local_288);
          io::Printer::Indent(printer);
          pFVar5 = FieldGeneratorMap::get(&this->field_generators_,pFVar14);
          (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
        }
        uVar21 = uVar21 + 1;
      }
    }
    else {
      RequiredFieldsBitMask(&masks_for_has_bits,this);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"if (",&local_291);
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (pAVar20 = (AlphaNum *)0x0;
          b = (AlphaNum *)
              ((long)masks_for_has_bits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)masks_for_has_bits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2), pAVar20 < b;
          pAVar20 = (AlphaNum *)((long)&pAVar20->piece_data_ + 1)) {
        hex.value = (ulong)masks_for_has_bits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)pAVar20];
        if (hex.value != 0) {
          local_288 = "0x";
          local_280 = (char *)0x2;
          hex._8_8_ = 8;
          strings::AlphaNum::AlphaNum(&local_228,hex);
          StrCat_abi_cxx11_(&m,(protobuf *)&local_288,&local_228,b);
          local_288 = "((_has_bits_[";
          local_280 = (char *)0xd;
          strings::AlphaNum::AlphaNum(&local_228,(int32)pAVar20);
          local_e0.piece_data_ = "] & ";
          local_e0.piece_size_ = 4;
          result._M_dataplus = m._M_dataplus;
          result._M_string_length = m._M_string_length;
          local_190.piece_data_ = ") ^ ";
          local_190.piece_size_ = 4;
          local_80.piece_data_ = m._M_dataplus._M_p;
          local_80.piece_size_ = m._M_string_length;
          local_b0.piece_data_ = ")";
          local_b0.piece_size_ = 1;
          c = (AlphaNum *)&result;
          StrCat_abi_cxx11_(&local_50,(protobuf *)&local_288,&local_228,&local_e0,c,&local_190,
                            &local_80,&local_b0,in_stack_fffffffffffffd48);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parts,
                     &local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&m);
        }
      }
      if (parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        b = (AlphaNum *)0xf54;
        internal::LogMessage::LogMessage
                  ((LogMessage *)&local_288,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xf54);
        pLVar4 = internal::LogMessage::operator<<
                           ((LogMessage *)&local_288,"CHECK failed: !parts.empty(): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar4);
        internal::LogMessage::~LogMessage((LogMessage *)&local_288);
      }
      if ((long)parts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)parts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        std::__cxx11::string::string
                  ((string *)&result,
                   (string *)
                   parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        local_288 = "(";
        local_280 = (char *)0x1;
        Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)&local_190,(protobuf *)&parts,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)"\n       | ",(char *)b);
        local_228.piece_data_ = local_190.piece_data_;
        local_228.piece_size_ = local_190.piece_size_;
        local_e0.piece_data_ = ")";
        local_e0.piece_size_ = 1;
        StrCat_abi_cxx11_(&result,(protobuf *)&local_288,&local_228,&local_e0,c);
        std::__cxx11::string::~string((string *)&local_190);
      }
      std::operator+(&local_160,&result," == 0");
      std::__cxx11::string::~string((string *)&result);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&parts);
      std::operator+(&local_120,&local_140,&local_160);
      std::operator+(&local_100,&local_120,") {  // All required fields are present.\n");
      io::Printer::Print(printer,local_100._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_140);
      io::Printer::Indent(printer);
      uVar21 = 0;
      while( true ) {
        ppFVar7 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->optimized_order_).
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7 >> 3) <= uVar21
           ) break;
        pFVar14 = ppFVar7[uVar21];
        if (*(int *)(pFVar14 + 0x4c) == 2) {
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar14);
          pFVar5 = FieldGeneratorMap::get(&this->field_generators_,pFVar14);
          (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
          io::Printer::Print(printer,"\n");
        }
        uVar21 = uVar21 + 1;
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"} else {\n  total_size += RequiredFieldsByteSizeFallback();\n}\n")
      ;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                );
    }
    local_250 = &this->field_generators_;
    local_290 = (ulong)local_290._4_4_ << 0x20;
    iVar16 = -1;
    while( true ) {
      iVar13 = (int)local_290;
      uVar22 = (ulong)(int)local_290;
      ppFVar7 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppFVar11 = (this->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      uVar21 = (long)ppFVar11 - (long)ppFVar7 >> 3;
      if (uVar21 <= uVar22) break;
      if ((int)local_290 == iVar16) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&local_288,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xfd8);
        pLVar4 = internal::LogMessage::operator<<
                           ((LogMessage *)&local_288,"CHECK failed: (i) != (last_i): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar4);
        internal::LogMessage::~LogMessage((LogMessage *)&local_288);
        ppFVar7 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppFVar11 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar21 = (long)ppFVar11 - (long)ppFVar7 >> 3;
      }
      if (uVar21 <= uVar22) {
        uVar21 = uVar22;
      }
      while ((uVar15 = uVar21, uVar21 != uVar22 &&
             (uVar15 = uVar22, *(int *)(ppFVar7[uVar22] + 0x4c) == 2))) {
        uVar22 = uVar22 + 1;
      }
      uVar21 = (ulong)(int)uVar15;
      while ((uVar21 < (ulong)((long)ppFVar11 - (long)ppFVar7 >> 3) &&
             (pFVar14 = ppFVar7[uVar21], *(int *)(pFVar14 + 0x4c) == 3))) {
        anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar14);
        pFVar5 = FieldGeneratorMap::get(local_250,pFVar14);
        (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
        io::Printer::Print(printer,"\n");
        uVar21 = uVar21 + 1;
        ppFVar7 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppFVar11 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      this_01 = (protobuf *)0x0;
      uVar22 = 0xffffffffffffffff;
      local_29c = -1;
      uVar15 = 0xffffffff;
      local_298 = local_29c;
      while( true ) {
        local_290 = CONCAT44(local_290._4_4_,(int)uVar21);
        iVar18 = (int)uVar15;
        uVar3 = (uint)this_01;
        iVar16 = iVar13;
        if (((ulong)((long)ppFVar11 - (long)ppFVar7 >> 3) <= uVar21) ||
           ((*(uint *)(ppFVar7[uVar21] + 0x4c) & 0xfffffffe) == 2)) break;
        uVar10 = 0;
        iVar17 = (int)uVar21;
        if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
          pcVar19 = FieldDescriptor::index
                              (ppFVar7[uVar21],(char *)(uVar21 & 0xffffffff),(int)uVar22);
          uVar10 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)pcVar19];
          iVar17 = (int)local_290;
        }
        uVar1 = (long)(int)uVar10 / 8;
        uVar8 = uVar1 & 0xffffffff;
        uVar22 = (long)(int)uVar10 % 8 & 0xffffffff;
        iVar2 = iVar17;
        if (iVar18 != -1) {
          if ((int)uVar1 != iVar18) goto LAB_0027ded0;
          uVar8 = uVar15;
          iVar17 = (int)local_290;
          iVar2 = local_29c;
        }
        local_29c = iVar2;
        this_01 = (protobuf *)(ulong)(uVar3 | 1 << (uVar10 & 0x1f));
        uVar21 = uVar21 + 1;
        ppFVar7 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppFVar11 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar15 = uVar8;
        local_298 = iVar17;
      }
      if (iVar18 != -1) {
LAB_0027ded0:
        if (local_29c == -1) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&local_288,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x1013);
          pLVar4 = internal::LogMessage::operator<<
                             ((LogMessage *)&local_288,"CHECK failed: (-1) != (last_chunk_start): ")
          ;
          internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar4);
          internal::LogMessage::~LogMessage((LogMessage *)&local_288);
        }
        if (local_298 == -1) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&local_288,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x1014);
          pLVar4 = internal::LogMessage::operator<<
                             ((LogMessage *)&local_288,"CHECK failed: (-1) != (last_chunk_end): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar4);
          internal::LogMessage::~LogMessage((LogMessage *)&local_288);
        }
        if (uVar3 == 0) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&local_288,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x1015);
          pLVar4 = internal::LogMessage::operator<<
                             ((LogMessage *)&local_288,"CHECK failed: (0) != (last_chunk_mask): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar4);
          internal::LogMessage::~LogMessage((LogMessage *)&local_288);
        }
        uVar3 = popcnt(uVar3);
        bVar25 = *(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3;
        bVar12 = local_29c != local_298 && bVar25;
        iVar13 = CONCAT31((int3)((uint)local_298 >> 8),bVar12);
        if (local_29c != local_298 && bVar25) {
          if ((int)uVar3 < 2) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&local_288,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x101f);
            pLVar4 = internal::LogMessage::operator<<
                               ((LogMessage *)&local_288,"CHECK failed: (2) <= (count): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar4);
LAB_0027e065:
            internal::LogMessage::~LogMessage((LogMessage *)&local_288);
            iVar13 = extraout_EDX;
          }
          else if (8 < uVar3) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&local_288,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x1020);
            pLVar4 = internal::LogMessage::operator<<
                               ((LogMessage *)&local_288,"CHECK failed: (8) >= (count): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_228,pLVar4);
            goto LAB_0027e065;
          }
          SimpleItoa_abi_cxx11_((string *)&local_288,(protobuf *)(ulong)(uint)(iVar18 << 3),iVar13);
          SimpleItoa_abi_cxx11_((string *)&local_228,this_01,i_00);
          io::Printer::Print(printer,"if (_has_bits_[$index$ / 32] & $mask$u) {\n","index",
                             (string *)&local_288,"mask",(string *)&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)&local_288);
          io::Printer::Indent(printer);
        }
        for (lVar23 = (long)local_29c; lVar23 <= local_298; lVar23 = lVar23 + 1) {
          pFVar14 = (this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar23];
          pFVar5 = FieldGeneratorMap::get(local_250,pFVar14);
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar14);
          if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_288,"this->",(allocator<char> *)&local_228);
            bVar25 = anon_unknown_0::EmitFieldNonDefaultCondition
                               (printer,(string *)&local_288,pFVar14);
            std::__cxx11::string::~string((string *)&local_288);
            (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
            if (bVar25) goto LAB_0027e1ad;
          }
          else {
            FieldName_abi_cxx11_((string *)&local_288,(cpp *)pFVar14,field_00);
            io::Printer::Print(printer,"if (has_$name$()) {\n","name",(string *)&local_288);
            std::__cxx11::string::~string((string *)&local_288);
            io::Printer::Indent(printer);
            (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
LAB_0027e1ad:
            io::Printer::Outdent(printer);
            io::Printer::Print(printer,"}\n\n");
          }
        }
        if (bVar12) {
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
        }
      }
    }
    pcVar19 = "}\n";
    lVar23 = 0;
    while (lVar23 < *(int *)(this->descriptor_ + 0x38)) {
      lVar24 = lVar23 * 0x30;
      local_290 = lVar23;
      io::Printer::Print(printer,"switch ($oneofname$_case()) {\n","oneofname",
                         *(string **)(*(long *)(this->descriptor_ + 0x40) + lVar24));
      io::Printer::Indent(printer);
      for (lVar23 = 0; puVar9 = (undefined8 *)(*(long *)(this->descriptor_ + 0x40) + lVar24),
          lVar23 < *(int *)(*(long *)(this->descriptor_ + 0x40) + 0x1c + lVar24);
          lVar23 = lVar23 + 1) {
        pFVar14 = *(FieldDescriptor **)(puVar9[4] + lVar23 * 8);
        anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar14);
        UnderscoresToCamelCase((string *)&local_288,*(string **)pFVar14,true);
        io::Printer::Print(printer,"case k$field_name$: {\n","field_name",(string *)&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        io::Printer::Indent(printer);
        pFVar5 = FieldGeneratorMap::get(local_250,pFVar14);
        (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
        io::Printer::Print(printer,"break;\n");
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
      }
      ToUpper((string *)&local_288,(string *)*puVar9);
      io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","cap_oneof_name",
                         (string *)&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      lVar23 = local_290 + 1;
    }
    if (this->num_weak_fields_ != 0) {
      io::Printer::Print(printer,"total_size += _weak_field_map_.ByteSizeLong();\n");
    }
    io::Printer::Print(printer,
                       "int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\nGOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n_cached_size_ = cached_size;\nGOOGLE_SAFE_CONCURRENT_WRITES_END();\nreturn total_size;\n"
                      );
    io::Printer::Outdent(printer);
  }
  io::Printer::Print(printer,pcVar19);
  return;
}

Assistant:

void MessageGenerator::
GenerateByteSize(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
        "size_t $classname$::ByteSizeLong() const {\n"
        "// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n"
        "  size_t total_size = _extensions_.MessageSetByteSize();\n",
        "classname", classname_, "full_name", descriptor_->full_name());
    GOOGLE_CHECK(UseUnknownFieldSet(descriptor_->file(), options_));
    printer->Print(
      "if (_internal_metadata_.have_unknown_fields()) {\n"
      "  total_size += ::google::protobuf::internal::WireFormat::\n"
      "      ComputeUnknownMessageSetItemsSize(unknown_fields());\n"
      "}\n");
    printer->Print(
      "  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\n"
      "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
      "  _cached_size_ = cached_size;\n"
      "  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
      "  return total_size;\n"
      "}\n");
    return;
  }

  if (num_required_fields_ > 1 && HasFieldPresence(descriptor_->file())) {
    // Emit a function (rarely used, we hope) that handles the required fields
    // by checking for each one individually.
    printer->Print(
        "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n"
        "// @@protoc_insertion_point(required_fields_byte_size_fallback_start:"
        "$full_name$)\n",
        "classname", classname_, "full_name", descriptor_->full_name());
    printer->Indent();
    printer->Print("size_t total_size = 0;\n");
    for (int i = 0; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_required()) {
        printer->Print("\n"
                       "if (has_$name$()) {\n",
                       "name", FieldName(field));
        printer->Indent();
        PrintFieldComment(printer, field);
        field_generators_.get(field).GenerateByteSize(printer);
        printer->Outdent();
        printer->Print("}\n");
      }
    }
    printer->Print("\n"
                   "return total_size;\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  printer->Print(
      "size_t $classname$::ByteSizeLong() const {\n"
      "// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n",
      "classname", classname_, "full_name", descriptor_->full_name());
  printer->Indent();
  printer->Print(
    "size_t total_size = 0;\n"
    "\n");

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "total_size += _extensions_.ByteSize();\n"
      "\n");
  }

  if (PreserveUnknownFields(descriptor_)) {
    if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print(
        "if (_internal_metadata_.have_unknown_fields()) {\n"
        "  total_size +=\n"
        "    ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n"
        "      unknown_fields());\n"
        "}\n");
    } else {
      printer->Print(
        "total_size += unknown_fields().size();\n"
        "\n");
    }
  }

  // Handle required fields (if any).  We expect all of them to be
  // present, so emit one conditional that checks for that.  If they are all
  // present then the fast path executes; otherwise the slow path executes.
  if (num_required_fields_ > 1 && HasFieldPresence(descriptor_->file())) {
    // The fast path works if all required fields are present.
    const std::vector<uint32> masks_for_has_bits = RequiredFieldsBitMask();
    printer->Print((string("if (") +
                    ConditionalToCheckBitmasks(masks_for_has_bits) +
                    ") {  // All required fields are present.\n").c_str());
    printer->Indent();
    // Oneof fields cannot be required, so optimized_order_ contains all of the
    // fields that we need to potentially emit.
    for (int i = 0; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_required()) continue;
      PrintFieldComment(printer, field);
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Print("\n");
    }
    printer->Outdent();
    printer->Print("} else {\n"  // the slow path
                   "  total_size += RequiredFieldsByteSizeFallback();\n"
                   "}\n");
  } else {
    // num_required_fields_ <= 1: no need to be tricky
    for (int i = 0; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_required()) continue;
      PrintFieldComment(printer, field);
      printer->Print("if (has_$name$()) {\n",
                     "name", FieldName(field));
      printer->Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Outdent();
      printer->Print("}\n");
    }
  }

  int last_i = -1;
  for (int i = 0; i < optimized_order_.size(); ) {
    // Detect infinite loops.
    GOOGLE_CHECK_NE(i, last_i);
    last_i = i;

    // Skip required fields.
    for (; i < optimized_order_.size() &&
         optimized_order_[i]->is_required(); i++) {
    }

    // Handle repeated fields.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_repeated()) {
        break;
      }

      PrintFieldComment(printer, field);
      const FieldGenerator& generator = field_generators_.get(field);
      generator.GenerateByteSize(printer);
      printer->Print("\n");
    }

    // Handle optional (non-repeated/oneof) fields.
    //
    // These are handled in chunks of 8.  The first chunk is
    // the non-requireds-non-repeateds-non-unions-non-extensions in
    //  descriptor_->field(0), descriptor_->field(1), ... descriptor_->field(7),
    // and the second chunk is the same for
    //  descriptor_->field(8), descriptor_->field(9), ...
    //  descriptor_->field(15),
    // etc.
    int last_chunk = -1;
    int last_chunk_start = -1;
    int last_chunk_end = -1;
    uint32 last_chunk_mask = 0;
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_repeated() || field->is_required()) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    if (last_chunk != -1) {
      GOOGLE_DCHECK_NE(-1, last_chunk_start);
      GOOGLE_DCHECK_NE(-1, last_chunk_end);
      GOOGLE_DCHECK_NE(0, last_chunk_mask);

      const int count = popcnt(last_chunk_mask);
      const bool have_outer_if = HasFieldPresence(descriptor_->file()) &&
          (last_chunk_start != last_chunk_end);

      if (have_outer_if) {
        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        GOOGLE_DCHECK_LE(2, count);
        GOOGLE_DCHECK_GE(8, count);

        printer->Print(
          "if (_has_bits_[$index$ / 32] & $mask$u) {\n",
          "index", SimpleItoa(last_chunk * 8),
          "mask", SimpleItoa(last_chunk_mask));
        printer->Indent();
      }

      // Go back and emit checks for each of the fields we processed.
      for (int j = last_chunk_start; j <= last_chunk_end; j++) {
        const FieldDescriptor* field = optimized_order_[j];
        const FieldGenerator& generator = field_generators_.get(field);

        PrintFieldComment(printer, field);

        bool have_enclosing_if = false;
        if (HasFieldPresence(descriptor_->file())) {
          printer->Print(
            "if (has_$name$()) {\n",
            "name", FieldName(field));
          printer->Indent();
          have_enclosing_if = true;
        } else {
          // Without field presence: field is serialized only if it has a
          // non-default value.
          have_enclosing_if = EmitFieldNonDefaultCondition(
              printer, "this->", field);
        }

        generator.GenerateByteSize(printer);

        if (have_enclosing_if) {
          printer->Outdent();
          printer->Print(
            "}\n"
            "\n");
        }
      }

      if (have_outer_if) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Fields inside a oneof don't use _has_bits_ so we count them in a separate
  // pass.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "switch ($oneofname$_case()) {\n",
        "oneofname", descriptor_->oneof_decl(i)->name());
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      PrintFieldComment(printer, field);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }

  if (num_weak_fields_) {
    // TagSize + MessageSize
    printer->Print("total_size += _weak_field_map_.ByteSizeLong();\n");
  }

  // We update _cached_size_ even though this is a const method.  In theory,
  // this is not thread-compatible, because concurrent writes have undefined
  // results.  In practice, since any concurrent writes will be writing the
  // exact same value, it works on all common processors.  In a future version
  // of C++, _cached_size_ should be made into an atomic<int>.
  printer->Print(
    "int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\n"
    "GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
    "_cached_size_ = cached_size;\n"
    "GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
    "return total_size;\n");

  printer->Outdent();
  printer->Print("}\n");
}